

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t HUF_decompress4X1_usingDTable_internal_fast
                 (void *dst,size_t dstSize,void *cSrc,size_t cSrcSize,HUF_DTable *DTable,
                 HUF_DecompressFastLoopFn loopFn)

{
  byte bVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  BYTE *pBVar8;
  uint uVar9;
  long *plVar11;
  BYTE *pBVar12;
  BYTE *pBVar13;
  long lVar14;
  bool bVar15;
  HUF_DecompressFastArgs args;
  size_t local_e8;
  HUF_DecompressFastArgs local_c8;
  ulong uVar10;
  
  local_e8 = HUF_DecompressFastArgs_init(&local_c8,dst,dstSize,cSrc,cSrcSize,DTable);
  if (local_e8 - 1 < 0xffffffffffffff88) {
    if (local_c8.ip[0] < local_c8.ilimit) {
      __assert_fail("args.ip[0] >= args.ilimit",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x8f5f,
                    "size_t HUF_decompress4X1_usingDTable_internal_fast(void *, size_t, const void *, size_t, const HUF_DTable *, HUF_DecompressFastLoopFn)"
                   );
    }
    pBVar13 = (BYTE *)((long)cSrc + 6);
    HUF_decompress4X1_usingDTable_internal_fast_c_loop(&local_c8);
    if (local_c8.ip[0] < pBVar13) {
      __assert_fail("args.ip[0] >= iend",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x8f65,
                    "size_t HUF_decompress4X1_usingDTable_internal_fast(void *, size_t, const void *, size_t, const HUF_DTable *, HUF_DecompressFastLoopFn)"
                   );
    }
    if (local_c8.ip[1] < pBVar13) {
      __assert_fail("args.ip[1] >= iend",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x8f66,
                    "size_t HUF_decompress4X1_usingDTable_internal_fast(void *, size_t, const void *, size_t, const HUF_DTable *, HUF_DecompressFastLoopFn)"
                   );
    }
    if (local_c8.ip[2] < pBVar13) {
      __assert_fail("args.ip[2] >= iend",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x8f67,
                    "size_t HUF_decompress4X1_usingDTable_internal_fast(void *, size_t, const void *, size_t, const HUF_DTable *, HUF_DecompressFastLoopFn)"
                   );
    }
    if (local_c8.ip[3] < pBVar13) {
      __assert_fail("args.ip[3] >= iend",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x8f68,
                    "size_t HUF_decompress4X1_usingDTable_internal_fast(void *, size_t, const void *, size_t, const HUF_DTable *, HUF_DecompressFastLoopFn)"
                   );
    }
    pBVar13 = (BYTE *)((long)dst + dstSize);
    if (pBVar13 < local_c8.op[3]) {
      __assert_fail("args.op[3] <= oend",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x8f69,
                    "size_t HUF_decompress4X1_usingDTable_internal_fast(void *, size_t, const void *, size_t, const HUF_DTable *, HUF_DecompressFastLoopFn)"
                   );
    }
    uVar2 = dstSize + 3 >> 2;
    lVar6 = 0;
    do {
      uVar3 = (long)pBVar13 - (long)dst;
      dst = (BYTE *)((long)dst + uVar2);
      if (uVar3 < uVar2) {
        dst = pBVar13;
      }
      pBVar8 = local_c8.op[lVar6];
      if (dst < pBVar8) {
        return 0xffffffffffffffec;
      }
      plVar11 = (long *)local_c8.ip[lVar6];
      if (plVar11 < local_c8.iend[lVar6] + -8) {
        return 0xffffffffffffffec;
      }
      lVar14 = *plVar11;
      uVar10 = 0;
      for (uVar3 = local_c8.bits[lVar6]; (uVar3 & 1) == 0; uVar3 = uVar3 >> 1 | 0x8000000000000000)
      {
        uVar10 = uVar10 + 1;
      }
      lVar4 = (long)dst - (long)pBVar8;
      pBVar12 = pBVar8;
      if (3 < lVar4) {
        do {
          if (plVar11 < (long *)((long)local_c8.iend[0] + 8)) {
            if (plVar11 == (long *)local_c8.iend[0]) goto LAB_001d75df;
            uVar5 = uVar10 >> 3 & 0x1fffffff;
            bVar15 = local_c8.iend[0] <= (long *)((long)plVar11 - uVar5);
            uVar3 = (ulong)(uint)((int)plVar11 - (int)local_c8.iend[0]);
            if (bVar15) {
              uVar3 = uVar5;
            }
            uVar9 = (uint)uVar10 + (int)uVar3 * -8;
          }
          else {
            uVar3 = uVar10 >> 3 & 0x1fffffff;
            uVar9 = (uint)uVar10 & 7;
            bVar15 = true;
          }
          uVar10 = (ulong)uVar9;
          plVar11 = (long *)((long)plVar11 - uVar3);
          lVar14 = *plVar11;
          if (((BYTE *)((long)dst + -3) <= pBVar12) || (!bVar15)) goto LAB_001d75df;
          uVar3 = (ulong)(lVar14 << (uVar10 & 0x3f)) >> 0x35;
          uVar9 = *(byte *)((long)DTable + uVar3 * 2 + 4) + uVar9;
          *pBVar12 = *(BYTE *)((long)DTable + uVar3 * 2 + 5);
          uVar3 = (ulong)(lVar14 << ((ulong)uVar9 & 0x3f)) >> 0x35;
          uVar9 = *(byte *)((long)DTable + uVar3 * 2 + 4) + uVar9;
          pBVar12[1] = *(BYTE *)((long)DTable + uVar3 * 2 + 5);
          uVar3 = (ulong)(lVar14 << ((ulong)uVar9 & 0x3f)) >> 0x35;
          uVar9 = *(byte *)((long)DTable + uVar3 * 2 + 4) + uVar9;
          pBVar12[2] = *(BYTE *)((long)DTable + uVar3 * 2 + 5);
          uVar3 = (ulong)(lVar14 << ((ulong)uVar9 & 0x3f)) >> 0x35;
          uVar9 = *(byte *)((long)DTable + uVar3 * 2 + 4) + uVar9;
          uVar10 = (ulong)uVar9;
          pBVar12[3] = *(BYTE *)((long)DTable + uVar3 * 2 + 5);
          pBVar12 = pBVar12 + 4;
          if (0x40 < uVar9) goto LAB_001d75df;
        } while( true );
      }
      if (plVar11 < (long *)((long)local_c8.iend[0] + 8)) {
        if (plVar11 != (long *)local_c8.iend[0]) {
          uVar5 = uVar10 >> 3 & 0x1fffffff;
          uVar3 = (ulong)(uint)((int)plVar11 - (int)local_c8.iend[0]);
          if (local_c8.iend[0] <= (long *)((long)plVar11 - uVar5)) {
            uVar3 = uVar5;
          }
          uVar9 = (uint)uVar10 + (int)uVar3 * -8;
          goto LAB_001d75d6;
        }
      }
      else {
        uVar3 = uVar10 >> 3 & 0x1fffffff;
        uVar9 = (uint)uVar10 & 7;
LAB_001d75d6:
        uVar10 = (ulong)uVar9;
        lVar14 = *(long *)((long)plVar11 - uVar3);
      }
LAB_001d75df:
      if (pBVar12 < dst) {
        lVar7 = 0;
        do {
          uVar3 = (ulong)(lVar14 << (uVar10 & 0x3f)) >> 0x35;
          bVar1 = *(byte *)((long)DTable + uVar3 * 2 + 4);
          pBVar12[lVar7] = *(BYTE *)((long)DTable + uVar3 * 2 + 5);
          lVar7 = lVar7 + 1;
          uVar10 = (ulong)((uint)bVar1 + (int)uVar10);
        } while ((long)dst - (long)pBVar12 != lVar7);
        pBVar8 = local_c8.op[lVar6];
      }
      local_c8.op[lVar6] = pBVar8 + lVar4;
      if (pBVar8 + lVar4 != (BYTE *)dst) {
        return 0xffffffffffffffec;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != 4);
    local_e8 = dstSize;
    if (dstSize == 0) {
      __assert_fail("dstSize != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x8f7e,
                    "size_t HUF_decompress4X1_usingDTable_internal_fast(void *, size_t, const void *, size_t, const HUF_DTable *, HUF_DecompressFastLoopFn)"
                   );
    }
  }
  return local_e8;
}

Assistant:

static HUF_FAST_BMI2_ATTRS
size_t
HUF_decompress4X1_usingDTable_internal_fast(
          void* dst,  size_t dstSize,
    const void* cSrc, size_t cSrcSize,
    const HUF_DTable* DTable,
    HUF_DecompressFastLoopFn loopFn)
{
    void const* dt = DTable + 1;
    const BYTE* const iend = (const BYTE*)cSrc + 6;
    BYTE* const oend = (BYTE*)dst + dstSize;
    HUF_DecompressFastArgs args;
    {   size_t const ret = HUF_DecompressFastArgs_init(&args, dst, dstSize, cSrc, cSrcSize, DTable);
        FORWARD_IF_ERROR(ret, "Failed to init fast loop args");
        if (ret == 0)
            return 0;
    }

    assert(args.ip[0] >= args.ilimit);
    loopFn(&args);

    /* Our loop guarantees that ip[] >= ilimit and that we haven't
    * overwritten any op[].
    */
    assert(args.ip[0] >= iend);
    assert(args.ip[1] >= iend);
    assert(args.ip[2] >= iend);
    assert(args.ip[3] >= iend);
    assert(args.op[3] <= oend);
    (void)iend;

    /* finish bit streams one by one. */
    {   size_t const segmentSize = (dstSize+3) / 4;
        BYTE* segmentEnd = (BYTE*)dst;
        int i;
        for (i = 0; i < 4; ++i) {
            BIT_DStream_t bit;
            if (segmentSize <= (size_t)(oend - segmentEnd))
                segmentEnd += segmentSize;
            else
                segmentEnd = oend;
            FORWARD_IF_ERROR(HUF_initRemainingDStream(&bit, &args, i, segmentEnd), "corruption");
            /* Decompress and validate that we've produced exactly the expected length. */
            args.op[i] += HUF_decodeStreamX1(args.op[i], &bit, segmentEnd, (HUF_DEltX1 const*)dt, HUF_DECODER_FAST_TABLELOG);
            if (args.op[i] != segmentEnd) return ERROR(corruption_detected);
        }
    }

    /* decoded size */
    assert(dstSize != 0);
    return dstSize;
}